

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O3

void __thiscall Kumu::FileReader::~FileReader(FileReader *this)

{
  ~FileReader(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

Kumu::FileReader::~FileReader()
{
  Kumu::FileReader::Close();
}